

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O1

bool __thiscall Disa::Adjacency_Graph<false>::insert(Adjacency_Graph<false> *this,Edge *edge)

{
  unsigned_long *puVar1;
  long *plVar2;
  long lVar3;
  unsigned_long uVar4;
  Edge *pEVar5;
  bool bVar6;
  ulong uVar7;
  long *plVar8;
  ostream *poVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  source_location *in_RCX;
  long lVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  Edge *pEVar13;
  bool bVar14;
  size_type *local_110;
  size_type local_108;
  size_type local_100;
  undefined8 uStack_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined **local_30;
  
  puVar1 = &edge->second;
  if (edge->first == edge->second) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_30 = &PTR_s__workspace_llm4binary_github_lic_00177418;
    console_format_abi_cxx11_(&local_50,(Disa *)0x0,(Log_Level)&local_30,in_RCX);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__cxx11::to_string(&local_b0,edge->first);
    std::operator+(&local_90,"Edge vertices identical, ",&local_b0);
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_90," and ");
    local_f0._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
    paVar12 = &pbVar10->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == paVar12) {
      local_f0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    }
    local_f0._M_string_length = pbVar10->_M_string_length;
    (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
    pbVar10->_M_string_length = 0;
    (pbVar10->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::to_string(&local_d0,*puVar1);
    std::operator+(&local_70,&local_f0,&local_d0);
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_70,".");
    local_110 = (size_type *)(pbVar10->_M_dataplus)._M_p;
    paVar12 = &pbVar10->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110 == paVar12) {
      local_100 = paVar12->_M_allocated_capacity;
      uStack_f8 = *(undefined8 *)((long)&pbVar10->field_2 + 8);
      local_110 = &local_100;
    }
    else {
      local_100 = paVar12->_M_allocated_capacity;
    }
    local_108 = pbVar10->_M_string_length;
    (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
    pbVar10->_M_string_length = 0;
    (pbVar10->field_2)._M_local_buf[0] = '\0';
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_110,local_108);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    exit(1);
  }
  bVar6 = contains(this,edge);
  if (!bVar6) {
    bVar14 = edge->first < edge->second;
    pEVar13 = (Edge *)puVar1;
    pEVar5 = edge;
    if (bVar14) {
      pEVar13 = edge;
      pEVar5 = (Edge *)puVar1;
    }
    uVar7 = (&edge->first)[bVar14];
    if ((&edge->first)[bVar14] < (&edge->first)[!bVar14]) {
      uVar7 = (&edge->first)[!bVar14];
    }
    if ((*(long *)(this + 0x20) - *(long *)(this + 0x18) == 0) ||
       ((*(long *)(this + 0x20) - *(long *)(this + 0x18) >> 3) - 1U <= uVar7)) {
      local_50._M_dataplus._M_p = (pointer)(uVar7 + 1);
      resize(this,(size_t *)&local_50);
    }
    insert_vertex_adjacent_list(this,pEVar13->first,pEVar5->first);
    lVar3 = *(long *)(this + 0x18);
    uVar4 = pEVar5->first;
    if (lVar3 + pEVar13->first * 8 + 8 != lVar3 + uVar4 * 8 + 0x10) {
      lVar11 = pEVar13->first << 3;
      do {
        plVar2 = (long *)(lVar3 + 8 + lVar11);
        *plVar2 = *plVar2 + 1;
        lVar11 = lVar11 + 8;
      } while (uVar4 * 8 + 8 != lVar11);
    }
    insert_vertex_adjacent_list(this,pEVar5->first,pEVar13->first);
    lVar3 = *(long *)(this + 0x18);
    plVar2 = (long *)(lVar3 + 8 + pEVar5->first * 8);
    *plVar2 = *plVar2 + 1;
    plVar2 = *(long **)(this + 0x20);
    for (plVar8 = (long *)(lVar3 + pEVar5->first * 8 + 0x10); plVar8 != plVar2; plVar8 = plVar8 + 1)
    {
      *plVar8 = *plVar8 + 2;
    }
  }
  return !bVar6;
}

Assistant:

bool Adjacency_Graph<_directed>::insert(const Edge& edge) {
  ASSERT_DEBUG(edge.first != edge.second,
               "Edge vertices identical, " + std::to_string(edge.first) + " and " + std::to_string(edge.second) + ".");

  // Preliminaries check if the edge exists, then determine if we need to resize.
  if(contains(edge)) return false;
  const auto& [i_first_vertex, i_second_vertex] =
  !_directed ? order_edge_vertex(&edge) : std::pair<const std::size_t&, const std::size_t&>({edge.first, edge.second});
  if(std::max(i_first_vertex, i_second_vertex) >= size_vertex()) resize(std::max(i_first_vertex, i_second_vertex) + 1);

  // Insert lower vertex.
  insert_vertex_adjacent_list(i_first_vertex, i_second_vertex);
  std::for_each(std::next(offset.begin(), static_cast<s_size_t>(i_first_vertex + 1)),
                !_directed ? std::next(offset.begin(), static_cast<s_size_t>(i_second_vertex + 2)) : offset.end(),
                [](std::size_t& off) { off++; });
  if(_directed) return true;

  // Insert upper vertex (tricky: last for loop is safe -> The highest vertex + 1 (for size) + 1 (for offset) <= end()).
  insert_vertex_adjacent_list(i_second_vertex, i_first_vertex);
  ++(*std::next(offset.begin(), static_cast<s_size_t>(i_second_vertex + 1)));
  std::for_each(std::next(offset.begin(), static_cast<s_size_t>(i_second_vertex + 2)), offset.end(),
                [](std::size_t& off) { off += 2; });

  return true;
}